

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst-tj.c
# Opt level: O2

void jpeg_mem_dest_tj(j_compress_ptr cinfo,uchar **outbuffer,unsigned_long *outsize,boolean alloc)

{
  jpeg_error_mgr *pjVar1;
  _func_boolean_j_compress_ptr *p_Var2;
  _func_boolean_j_compress_ptr *p_Var3;
  _func_boolean_j_compress_ptr *p_Var4;
  jpeg_destination_mgr *pjVar5;
  _func_void_j_compress_ptr *p_Var6;
  
  if (outbuffer == (uchar **)0x0 || outsize == (unsigned_long *)0x0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x17;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  pjVar5 = cinfo->dest;
  if (pjVar5 == (jpeg_destination_mgr *)0x0) {
    pjVar5 = (jpeg_destination_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x58);
    cinfo->dest = pjVar5;
    pjVar5[1].init_destination = (_func_void_j_compress_ptr *)0x0;
    pjVar5[1].empty_output_buffer = (_func_boolean_j_compress_ptr *)0x0;
  }
  else if (pjVar5->init_destination != init_mem_destination) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x17;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
    pjVar5 = cinfo->dest;
  }
  pjVar5->init_destination = init_mem_destination;
  pjVar5->empty_output_buffer = empty_mem_output_buffer;
  pjVar5->term_destination = term_mem_destination;
  p_Var2 = pjVar5[1].empty_output_buffer;
  p_Var3 = (_func_boolean_j_compress_ptr *)*outbuffer;
  pjVar5[1].next_output_byte = (JOCTET *)outbuffer;
  pjVar5[1].free_in_buffer = (size_t)outsize;
  *(boolean *)&pjVar5[2].next_output_byte = alloc;
  if ((*outbuffer == (uchar *)0x0) || (*outsize == 0)) {
    if (alloc == 0) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x17;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    else {
      p_Var6 = (_func_void_j_compress_ptr *)malloc(0x1000);
      *outbuffer = (uchar *)p_Var6;
      pjVar5[1].init_destination = p_Var6;
      if (p_Var6 == (_func_void_j_compress_ptr *)0x0) {
        *(undefined8 *)&cinfo->err->msg_code = 0xa00000036;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      *outsize = 0x1000;
    }
  }
  p_Var4 = (_func_boolean_j_compress_ptr *)*outbuffer;
  pjVar5[1].empty_output_buffer = p_Var4;
  pjVar5->next_output_byte = (JOCTET *)p_Var4;
  if (p_Var2 == p_Var3 && (alloc != 0 && p_Var2 != (_func_boolean_j_compress_ptr *)0x0)) {
    p_Var6 = pjVar5[1].term_destination;
  }
  else {
    p_Var6 = (_func_void_j_compress_ptr *)*outsize;
    pjVar5[1].term_destination = p_Var6;
  }
  pjVar5->free_in_buffer = (size_t)p_Var6;
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_dest_tj(j_compress_ptr cinfo, unsigned char **outbuffer,
                 unsigned long *outsize, boolean alloc)
{
  boolean reused = FALSE;
  my_mem_dest_ptr dest;

  if (outbuffer == NULL || outsize == NULL)     /* sanity check */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same buffer without re-executing jpeg_mem_dest.
   */
  if (cinfo->dest == NULL) {    /* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(my_mem_destination_mgr));
    dest = (my_mem_dest_ptr)cinfo->dest;
    dest->newbuffer = NULL;
    dest->buffer = NULL;
  } else if (cinfo->dest->init_destination != init_mem_destination) {
    /* It is unsafe to reuse the existing destination manager unless it was
     * created by this function.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  dest = (my_mem_dest_ptr)cinfo->dest;
  dest->pub.init_destination = init_mem_destination;
  dest->pub.empty_output_buffer = empty_mem_output_buffer;
  dest->pub.term_destination = term_mem_destination;
  if (dest->buffer == *outbuffer && *outbuffer != NULL && alloc)
    reused = TRUE;
  dest->outbuffer = outbuffer;
  dest->outsize = outsize;
  dest->alloc = alloc;

  if (*outbuffer == NULL || *outsize == 0) {
    if (alloc) {
      /* Allocate initial buffer */
      dest->newbuffer = *outbuffer = (unsigned char *)malloc(OUTPUT_BUF_SIZE);
      if (dest->newbuffer == NULL)
        ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 10);
      *outsize = OUTPUT_BUF_SIZE;
    } else
      ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  dest->pub.next_output_byte = dest->buffer = *outbuffer;
  if (!reused)
    dest->bufsize = *outsize;
  dest->pub.free_in_buffer = dest->bufsize;
}